

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::TableDeathTest_EraseOfEndAsserts_Test::TestBody
          (TableDeathTest_EraseOfEndAsserts_Test *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *message;
  char *regex;
  iterator iVar4;
  AssertHelper local_100;
  Message local_f8;
  int local_ec;
  exception *gtest_exception;
  anon_union_8_1_a8a14541_for_iterator_1 local_b8;
  iterator local_b0;
  ReturnSentinel local_a0;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  pointer local_78;
  DeathTest *gtest_dt;
  undefined8 local_60;
  char kDeathMsg [10];
  IntTable t;
  byte local_11;
  TableDeathTest_EraseOfEndAsserts_Test *pTStack_10;
  bool assert_enabled;
  TableDeathTest_EraseOfEndAsserts_Test *this_local;
  
  local_11 = 0;
  t.
  super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
  .settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       (_Tuple_impl<0UL,_unsigned_long,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
        )&local_11;
  pTStack_10 = this;
  bVar1 = TestBody::anon_class_8_1_402f6186::operator()
                    ((anon_class_8_1_402f6186 *)
                     &t.
                      super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                      .settings_);
  if (!bVar1) {
    __assert_fail("[&]() { assert_enabled = true; return true; }()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                  ,0x73b,
                  "virtual void phmap::priv::(anonymous namespace)::TableDeathTest_EraseOfEndAsserts_Test::TestBody()"
                 );
  }
  if ((local_11 & 1) == 0) {
    return;
  }
  IntTable::IntTable((IntTable *)(kDeathMsg + 8));
  local_60 = 0x6e65203d21207469;
  kDeathMsg[0] = 'd';
  kDeathMsg[1] = '\0';
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr,(internal *)&local_60,regex);
    bVar1 = testing::internal::DeathTest::Create
                      ("t.erase(t.end())",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr,
                       "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                       ,0x741,&local_78);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (local_78 == (pointer)0x0) goto LAB_0016ef83;
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel,local_78);
      iVar2 = (*local_78->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_78->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_78->_vptr_DeathTest[4])(local_78,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_0016eea0;
        local_ec = 2;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_a0,local_78);
          bVar1 = testing::internal::AlwaysTrue();
          iVar4.field_1.slot_ = local_b8.slot_;
          iVar4.ctrl_ = (ctrl_t *)gtest_exception;
          if (bVar1) {
            local_b0 = raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                       ::end((raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                              *)(kDeathMsg + 8));
            iVar4 = raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                    ::erase((raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                             *)(kDeathMsg + 8),local_b0);
          }
          local_b8 = iVar4.field_1;
          gtest_exception = (exception *)iVar4.ctrl_;
          (*local_78->_vptr_DeathTest[5])(local_78,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_a0);
        }
LAB_0016eea0:
        local_ec = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel);
      if (local_ec == 0) goto LAB_0016ef83;
    }
  }
  testing::Message::Message(&local_f8);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_100,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
             ,0x741,message);
  testing::internal::AssertHelper::operator=(&local_100,&local_f8);
  testing::internal::AssertHelper::~AssertHelper(&local_100);
  testing::Message::~Message(&local_f8);
LAB_0016ef83:
  IntTable::~IntTable((IntTable *)(kDeathMsg + 8));
  return;
}

Assistant:

TEST(TableDeathTest, EraseOfEndAsserts) {
  // Use an assert with side-effects to figure out if they are actually enabled.
  bool assert_enabled = false;
  assert([&]() {
    assert_enabled = true;
    return true;
  }());
  if (!assert_enabled) return;

  IntTable t;
  // Extra simple "regexp" as regexp support is highly varied across platforms.
  constexpr char kDeathMsg[] = "it != end";
  EXPECT_DEATH_IF_SUPPORTED(t.erase(t.end()), kDeathMsg);
}